

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O1

void __thiscall QtMWidgets::Picker::paintEvent(Picker *this,QPaintEvent *param_1)

{
  PickerPrivate *pPVar1;
  QAbstractItemModel *pQVar2;
  char cVar3;
  ColorGroup CVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long *plVar9;
  int offset;
  QPainter p;
  QStyleOption opt;
  QPainter local_b0 [8];
  int local_a8;
  int local_a4;
  QModelIndex local_a0;
  QModelIndex local_88;
  QStyleOption local_70 [16];
  QRect local_60 [3];
  
  QStyleOption::QStyleOption(local_70,1,0);
  QStyleOption::initFrom((QWidget *)local_70);
  QPainter::QPainter(local_b0,(QPaintDevice *)&this->field_0x10);
  CVar4 = QWidget::palette();
  plVar9 = (long *)QPalette::brush(CVar4,Dark);
  drawCylinder(local_b0,local_60,(QColor *)(*plVar9 + 8),true,true);
  pPVar1 = (this->d).d;
  pQVar2 = pPVar1->model;
  QPersistentModelIndex::operator_cast_to_QModelIndex(&local_a0,&pPVar1->root);
  iVar5 = (**(code **)(*(long *)pQVar2 + 0x78))(pQVar2,&local_a0);
  if (0 < iVar5) {
    cVar3 = QPersistentModelIndex::isValid();
    if (cVar3 == '\0') {
      pPVar1 = (this->d).d;
      pQVar2 = pPVar1->model;
      iVar5 = pPVar1->modelColumn;
      QPersistentModelIndex::operator_cast_to_QModelIndex(&local_88,&pPVar1->root);
      (**(code **)(*(long *)pQVar2 + 0x60))(&local_a0,pQVar2,0,iVar5,&local_88);
      QPersistentModelIndex::operator=(&((this->d).d)->topItemIndex,&local_a0);
      ((this->d).d)->drawItemOffset = 0;
    }
    PickerPrivate::initDrawOffsetForFirstUse((this->d).d);
    PickerPrivate::normalizeOffset((this->d).d);
    pPVar1 = (this->d).d;
    iVar8 = pPVar1->itemsCount;
    pQVar2 = pPVar1->model;
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_a0,&pPVar1->root);
    iVar6 = (**(code **)(*(long *)pQVar2 + 0x78))(pQVar2,&local_a0);
    pPVar1 = (this->d).d;
    iVar5 = pPVar1->itemsCount;
    offset = pPVar1->drawItemOffset;
    iVar7 = QPersistentModelIndex::row();
    local_a8 = iVar8 + (uint)(iVar5 <= iVar6);
    if (0 < local_a8) {
      iVar5 = 0;
      do {
        pPVar1 = (this->d).d;
        pQVar2 = pPVar1->model;
        QPersistentModelIndex::operator_cast_to_QModelIndex(&local_a0,&pPVar1->root);
        iVar8 = (**(code **)(*(long *)pQVar2 + 0x78))(pQVar2,&local_a0);
        if (iVar8 <= iVar5) break;
        pPVar1 = (this->d).d;
        pQVar2 = pPVar1->model;
        QPersistentModelIndex::operator_cast_to_QModelIndex(&local_a0,&pPVar1->root);
        iVar6 = (**(code **)(*(long *)pQVar2 + 0x78))(pQVar2,&local_a0);
        iVar8 = 0;
        if (iVar7 != iVar6) {
          iVar8 = iVar7;
        }
        pPVar1 = (this->d).d;
        pQVar2 = pPVar1->model;
        iVar7 = pPVar1->modelColumn;
        local_a4 = iVar5;
        QPersistentModelIndex::operator_cast_to_QModelIndex(&local_88,&pPVar1->root);
        (**(code **)(*(long *)pQVar2 + 0x60))(&local_a0,pQVar2,iVar8,iVar7,&local_88);
        PickerPrivate::drawItem(pPVar1,local_b0,local_70,offset,&local_a0);
        pPVar1 = (this->d).d;
        offset = offset + pPVar1->itemTopMargin + pPVar1->stringHeight;
        iVar7 = iVar8 + 1;
        iVar5 = local_a4 + 1;
      } while (local_a8 != iVar5);
    }
  }
  QPainter::~QPainter(local_b0);
  QStyleOption::~QStyleOption(local_70);
  return;
}

Assistant:

void
Picker::paintEvent( QPaintEvent * )
{
	QStyleOption opt;
	opt.initFrom( this );

	QPainter p( this );

	drawCylinder( &p, opt.rect, palette().color( QPalette::Dark ) );

	if( count() > 0 )
	{
		if( !d->topItemIndex.isValid() )
		{
			d->topItemIndex = d->model->index( 0, d->modelColumn, d->root );
			d->drawItemOffset = 0;
		}

		d->initDrawOffsetForFirstUse();
		d->normalizeOffset();

		int maxCount = d->itemsCount;

		if( count() >= d->itemsCount )
			++maxCount;

		int offset = d->drawItemOffset;

		for( int i = d->topItemIndex.row(), itemsCount = 0, scanedItems = 0;
			( itemsCount < maxCount ) && ( scanedItems < count() ) ;
			++i, ++scanedItems, ++itemsCount )
		{
			if( i == count() )
				i = 0;

			d->drawItem( &p, opt, offset,
				d->model->index( i, d->modelColumn, d->root ) );

			offset += d->itemTopMargin + d->stringHeight;
		}
	}
}